

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O1

QList<int> * __thiscall
QDBusMenuAdaptor::AboutToShowGroup
          (QList<int> *__return_storage_ptr__,QDBusMenuAdaptor *this,QList<int> *ids,
          QList<int> *idErrors)

{
  long lVar1;
  int *piVar2;
  QLoggingCategory *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QDebug local_50;
  QDebug local_48;
  Stream *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QtPrivateLogging::qLcMenu();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    local_40 = local_50.stream;
    local_50.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<int>>
              ((QtPrivate *)&local_48,(Stream *)&local_40,"QList",ids);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
  }
  QList<int>::clear(idErrors);
  lVar1 = (ids->d).size;
  if (lVar1 != 0) {
    piVar2 = (ids->d).ptr;
    lVar4 = 0;
    do {
      AboutToShow(this,*(int *)((long)piVar2 + lVar4));
      lVar4 = lVar4 + 4;
    } while (lVar1 << 2 != lVar4);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDBusMenuAdaptor::AboutToShowGroup(const QList<int> &ids, QList<int> &idErrors)
{
    qCDebug(qLcMenu) << ids;
    Q_UNUSED(idErrors);
    idErrors.clear();
    for (int id : ids)
        AboutToShow(id);
    return QList<int>(); // updatesNeeded
}